

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenConstSetValueI64Low(BinaryenExpressionRef expr,int32_t valueLow)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xad1,"void BinaryenConstSetValueI64Low(BinaryenExpressionRef, int32_t)");
  }
  if ((*(long *)(expr + 2) == 3) && (*(long *)(expr + 2) != 3)) {
    __assert_fail("type == Type::i64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                  ,0x129,"int64_t wasm::Literal::geti64() const");
  }
  local_28._0_8_ = ZEXT48(valueLow);
  local_18 = 3;
  wasm::Literal::operator=((Literal *)(expr + 1),(Literal *)&local_28.func);
  wasm::Literal::~Literal((Literal *)&local_28.func);
  return;
}

Assistant:

void BinaryenConstSetValueI64Low(BinaryenExpressionRef expr, int32_t valueLow) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  auto& value = static_cast<Const*>(expression)->value;
  int64_t valueI64 = value.type == Type::i64 ? value.geti64() : 0;
  static_cast<Const*>(expression)->value =
    Literal((valueI64 & ~0xffffffff) | (int64_t(valueLow) & 0xffffffff));
}